

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs_parser.cpp
# Opt level: O3

bool Satyricon::parse_file(SATSolver *solver,istream *is)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long *plVar5;
  domain_error *pdVar6;
  SATSolver *this;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  uint number_of_variable;
  int value;
  uint number_of_clausole;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> c;
  string p;
  string cnf;
  string line;
  string other;
  istringstream iss;
  int local_260;
  uint local_25c;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  SATSolver *local_1d8;
  string local_1d0;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_25c = 0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1d8 = solver;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (is,(string *)&local_1f8,cVar1);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_00110f1c;
  } while (*local_1f8._M_dataplus._M_p == 'c');
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_1f8,_S_in);
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_238);
  piVar4 = std::operator>>(piVar4,(string *)&local_218);
  piVar4 = std::istream::_M_extract<unsigned_int>((uint *)piVar4);
  piVar4 = std::istream::_M_extract<unsigned_int>((uint *)piVar4);
  if ((((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
       (piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1d0),
       ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0)) ||
      (iVar3 = std::__cxx11::string::compare((char *)&local_238), iVar3 != 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)&local_218), iVar3 != 0)) {
    pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (pdVar6,"expected a \'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE\' as first line");
    __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
LAB_00110f1c:
  this = local_1d8;
  SATSolver::set_number_of_variable(local_1d8,0);
  local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (Literal *)0x0;
  local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (Literal *)0x0;
  local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Literal *)0x0;
  uVar7 = 0;
  do {
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (is,(string *)&local_1f8,cVar1);
      bVar9 = ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0;
      bVar8 = uVar7 < local_25c;
      if (!bVar8 || !bVar9) goto LAB_001110a5;
    } while ((local_1f8._M_string_length == 0) || (*local_1f8._M_dataplus._M_p == 'c'));
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_1f8,_S_in);
    do {
      while( true ) {
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) != 0) {
          bVar2 = false;
          goto LAB_00111073;
        }
        plVar5 = (long *)std::istream::operator>>((istringstream *)local_1b0,&local_260);
        if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
          pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_238,"invalid simbol on clausole ",&local_1f8);
          std::domain_error::domain_error(pdVar6,(string *)&local_238);
          __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
        }
        iVar3 = -local_260;
        if (0 < local_260) {
          iVar3 = local_260;
        }
        if (iVar3 != 0) {
          pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,"invalid variable ","");
          std::__cxx11::to_string(&local_1d0,local_260);
          std::operator+(&local_238,&local_218,&local_1d0);
          std::domain_error::domain_error(pdVar6,(string *)&local_238);
          __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
        }
        if (local_260 == 0) break;
        iVar3 = -2 - (local_260 >> 0x1f);
        local_238._M_dataplus._M_p._0_4_ = iVar3;
        if (local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::
          _M_realloc_insert<Satyricon::Literal>
                    (&local_258,
                     (iterator)
                     local_258.
                     super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Literal *)&local_238);
        }
        else {
          (local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
           _M_impl.super__Vector_impl_data._M_finish)->value = iVar3;
          local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      bVar2 = SATSolver::add_clause(this,&local_258);
      if (local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      uVar7 = uVar7 + 1;
    } while (!bVar2);
    bVar2 = true;
LAB_00111073:
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    this = local_1d8;
  } while (!bVar2);
LAB_001110a5:
  if (local_258.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
      super__Vector_impl_data._M_start != (Literal *)0x0) {
    operator_delete(local_258.
                    super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  return bVar8 && bVar9;
}

Assistant:

bool Satyricon::parse_file(SATSolver& solver, std::istream & is)
{
    unsigned int number_of_clausole = 0, number_of_variable = 0;
    std::string line;

    // find header line
    while (getline(is, line)) {
        if (line[0] == 'c') continue;

        std::istringstream iss(line);
        std::string p, cnf, other;

        if ( !(iss >> p >> cnf >> number_of_variable >> number_of_clausole)
                || (iss >> other) || p != "p" || cnf != "cnf")
            throw std::domain_error(
                    "expected a 'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE'"
                    " as first line");
        break;
    }
    solver.set_number_of_variable(number_of_variable);

    unsigned int read_clausole = 0;
    // read clausoles

    std::vector<Literal> c;
    int value;

    while (getline(is, line) && read_clausole < number_of_clausole ) {
        if ( line.size() == 0 || line[0] == 'c') continue;

        std::istringstream iss(line);

        while( !iss.eof() ) {
            if ( !(iss >> value) )
                throw std::domain_error("invalid simbol on clausole " + line);
            if(static_cast<unsigned int>(abs(value)) > number_of_variable)
                throw std::domain_error(std::string("invalid variable ")+std::to_string(value));

            if (value == 0) {
                read_clausole++;
                bool conflict = solver.add_clause(c);
                c.clear();
                if ( conflict ) return true; // found a conflict
            }
            else {
                c.push_back( Literal(abs(value)-1, value < 0) );
            }
        }
    }

    return false; // no conflict
}